

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall
leveldb::DBImpl::FinishCompactionOutputFile(DBImpl *this,CompactionState *compact,Iterator *input)

{
  TableBuilder *this_00;
  TableCache *this_01;
  Logger *info_log;
  bool bVar1;
  uint uVar2;
  Output *pOVar3;
  uint64_t uVar4;
  uint64_t in_RCX;
  Status local_90;
  ReadOptions local_88;
  Iterator *local_78;
  Iterator *iter;
  Status local_68;
  uint64_t local_60;
  uint64_t current_bytes;
  uint64_t local_40;
  uint64_t current_entries;
  uint64_t local_30;
  uint64_t output_number;
  Iterator *input_local;
  CompactionState *compact_local;
  DBImpl *this_local;
  Status *s;
  
  input_local = input;
  compact_local = compact;
  this_local = this;
  if (input == (Iterator *)0x0) {
    __assert_fail("compact != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                  ,0x32c,
                  "Status leveldb::DBImpl::FinishCompactionOutputFile(CompactionState *, Iterator *)"
                 );
  }
  if (input[1]._vptr_Iterator == (_func_int **)0x0) {
    __assert_fail("compact->outfile != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                  ,0x32d,
                  "Status leveldb::DBImpl::FinishCompactionOutputFile(CompactionState *, Iterator *)"
                 );
  }
  if (input[1].cleanup_head_.function == (CleanupFunction)0x0) {
    __assert_fail("compact->builder != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                  ,0x32e,
                  "Status leveldb::DBImpl::FinishCompactionOutputFile(CompactionState *, Iterator *)"
                 );
  }
  output_number = in_RCX;
  pOVar3 = CompactionState::current_output((CompactionState *)input);
  local_30 = pOVar3->number;
  if (local_30 != 0) {
    current_entries._7_1_ = 0;
    (**(code **)(*(long *)output_number + 0x50))(this);
    local_40 = TableBuilder::NumEntries((TableBuilder *)input_local[1].cleanup_head_.function);
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      TableBuilder::Finish((TableBuilder *)&current_bytes);
      Status::operator=((Status *)this,(Status *)&current_bytes);
      Status::~Status((Status *)&current_bytes);
    }
    else {
      TableBuilder::Abandon((TableBuilder *)input_local[1].cleanup_head_.function);
    }
    uVar4 = TableBuilder::FileSize((TableBuilder *)input_local[1].cleanup_head_.function);
    local_60 = uVar4;
    pOVar3 = CompactionState::current_output((CompactionState *)input_local);
    pOVar3->file_size = uVar4;
    input_local[1].cleanup_head_.arg1 = (void *)(local_60 + (long)input_local[1].cleanup_head_.arg1)
    ;
    this_00 = (TableBuilder *)input_local[1].cleanup_head_.function;
    if (this_00 != (TableBuilder *)0x0) {
      TableBuilder::~TableBuilder(this_00);
      operator_delete(this_00);
    }
    input_local[1].cleanup_head_.function = (CleanupFunction)0x0;
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      (**(code **)(*input_local[1]._vptr_Iterator + 0x28))(&local_68);
      Status::operator=((Status *)this,&local_68);
      Status::~Status(&local_68);
    }
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      (**(code **)(*input_local[1]._vptr_Iterator + 0x18))(&iter);
      Status::operator=((Status *)this,(Status *)&iter);
      Status::~Status((Status *)&iter);
    }
    if (input_local[1]._vptr_Iterator != (_func_int **)0x0) {
      (**(code **)(*input_local[1]._vptr_Iterator + 8))();
    }
    input_local[1]._vptr_Iterator = (_func_int **)0x0;
    bVar1 = Status::ok((Status *)this);
    if ((bVar1) && (local_40 != 0)) {
      this_01 = (TableCache *)compact[2].total_bytes;
      local_88.verify_checksums = false;
      local_88.fill_cache = false;
      local_88._2_6_ = 0;
      local_88.snapshot = (Snapshot *)0x0;
      ReadOptions::ReadOptions(&local_88);
      local_78 = TableCache::NewIterator(this_01,&local_88,local_30,local_60,(Table **)0x0);
      (*local_78->_vptr_Iterator[10])(&local_90);
      Status::operator=((Status *)this,&local_90);
      Status::~Status(&local_90);
      if (local_78 != (Iterator *)0x0) {
        (*local_78->_vptr_Iterator[1])();
      }
      bVar1 = Status::ok((Status *)this);
      uVar4 = local_30;
      if (bVar1) {
        info_log = (Logger *)compact[1].smallest_snapshot;
        uVar2 = Compaction::level((Compaction *)input_local->_vptr_Iterator);
        Log(info_log,"Generated table #%llu@%d: %lld keys, %lld bytes",uVar4,(ulong)uVar2,local_40,
            local_60);
      }
    }
    return (Status)(char *)this;
  }
  __assert_fail("output_number != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                ,0x331,
                "Status leveldb::DBImpl::FinishCompactionOutputFile(CompactionState *, Iterator *)")
  ;
}

Assistant:

Status DBImpl::FinishCompactionOutputFile(CompactionState* compact,
                                          Iterator* input) {
  assert(compact != nullptr);
  assert(compact->outfile != nullptr);
  assert(compact->builder != nullptr);

  const uint64_t output_number = compact->current_output()->number;
  assert(output_number != 0);

  // Check for iterator errors
  Status s = input->status();
  const uint64_t current_entries = compact->builder->NumEntries();
  if (s.ok()) {
    s = compact->builder->Finish();
  } else {
    compact->builder->Abandon();
  }
  const uint64_t current_bytes = compact->builder->FileSize();
  compact->current_output()->file_size = current_bytes;
  compact->total_bytes += current_bytes;
  delete compact->builder;
  compact->builder = nullptr;

  // Finish and check for file errors
  if (s.ok()) {
    s = compact->outfile->Sync();
  }
  if (s.ok()) {
    s = compact->outfile->Close();
  }
  delete compact->outfile;
  compact->outfile = nullptr;

  if (s.ok() && current_entries > 0) {
    // Verify that the table is usable
    Iterator* iter =
        table_cache_->NewIterator(ReadOptions(), output_number, current_bytes);
    s = iter->status();
    delete iter;
    if (s.ok()) {
      Log(options_.info_log, "Generated table #%llu@%d: %lld keys, %lld bytes",
          (unsigned long long)output_number, compact->compaction->level(),
          (unsigned long long)current_entries,
          (unsigned long long)current_bytes);
    }
  }
  return s;
}